

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisRecordRepresentation0.cpp
# Opt level: O0

void __thiscall
DIS::GridAxisRecordRepresentation0::unmarshal
          (GridAxisRecordRepresentation0 *this,DataStream *dataStream)

{
  uchar local_1d;
  int local_1c;
  uint8_t x;
  DataStream *pDStack_18;
  int idx;
  DataStream *dataStream_local;
  GridAxisRecordRepresentation0 *this_local;
  
  pDStack_18 = dataStream;
  dataStream_local = (DataStream *)this;
  GridAxisRecord::unmarshal(&this->super_GridAxisRecord,dataStream);
  DataStream::operator>>(pDStack_18,(unsigned_short *)&(this->super_GridAxisRecord).field_0xc);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->_dataValues);
  for (local_1c = 0; local_1c < (int)(uint)*(ushort *)&(this->super_GridAxisRecord).field_0xc;
      local_1c = local_1c + 1) {
    DataStream::operator>>(pDStack_18,&local_1d);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->_dataValues,&local_1d);
  }
  return;
}

Assistant:

void GridAxisRecordRepresentation0::unmarshal(DataStream &dataStream) {
  GridAxisRecord::unmarshal(
      dataStream); // unmarshal information in superclass first
  dataStream >> _numberOfBytes;

  _dataValues.clear();
  for (auto idx = 0; idx < _numberOfBytes; ++idx) {
    uint8_t x;
    dataStream >> x;
    _dataValues.push_back(x);
  }
}